

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

ostream * node::operator<<(ostream *os,BlockfileType *type)

{
  long lVar1;
  int *in_RSI;
  ostream *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RSI == 0) {
    std::operator<<(in_RDI,"normal");
  }
  else if (*in_RSI == 1) {
    std::operator<<(in_RDI,"assumed");
  }
  else {
    std::ios::setstate((int)in_RDI + (int)in_RDI->_vptr_basic_ostream[-3]);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const BlockfileType& type) {
    switch(type) {
        case BlockfileType::NORMAL: os << "normal"; break;
        case BlockfileType::ASSUMED: os << "assumed"; break;
        default: os.setstate(std::ios_base::failbit);
    }
    return os;
}